

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O2

Value * DumpTarget(Value *__return_storage_ptr__,cmGeneratorTarget *target,string *config)

{
  _Rb_tree_node_base *__k;
  cmMakefile *this;
  cmSourceFile *this_00;
  string *psVar1;
  long lVar2;
  size_type sVar3;
  ValueHolder VVar4;
  undefined1 uVar5;
  pointer ppcVar6;
  bool bVar7;
  __type _Var8;
  TargetType targetType;
  cmLocalGenerator *pcVar9;
  char *pcVar10;
  Value *pVVar11;
  string *psVar12;
  cmListFileBacktrace *backtrace;
  OutputInfo *pOVar13;
  mapped_type *pmVar14;
  _Base_ptr p_Var15;
  pointer ppcVar16;
  cmLocalGenerator *lg;
  mapped_type *this_01;
  CommentInfo *pCVar17;
  CommentInfo *remote;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RDX_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RDX_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in;
  string *value;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool> *i_1;
  _Alloc_hider _Var18;
  const_iterator cVar19;
  const_iterator cVar20;
  string sysroot;
  cmLinkLineComputer linkLineComputer;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  vStack_5f0;
  string linkLanguageFlags;
  string frameworkPath;
  string linkPath;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  languages;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>_>_>
  languageDataMap;
  Value artifacts;
  __node_base_ptr p_Stack_4c0;
  ValueHolder local_4b8;
  undefined1 local_4b0;
  Value ttl;
  Value local_468;
  Value sourcesValue;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> files;
  Value statements;
  Value sourceGroupsValue;
  string typeName;
  Value crossRefs;
  string baseDir;
  ValueHolder local_348;
  undefined1 local_340;
  Value local_320;
  Value local_2f8;
  Value local_2d0;
  Value local_2a8;
  Value local_280;
  Value local_258;
  Value local_230;
  Value local_208;
  Value local_1e0;
  Value local_1b8;
  Value local_190;
  Value local_168;
  Value local_140;
  Value local_118;
  Value local_f0;
  Value local_c8;
  Value local_a0;
  ValueHolder local_78;
  undefined1 local_70;
  string relPath;
  
  pcVar9 = cmGeneratorTarget::GetLocalGenerator(target);
  cmLocalGenerator::GetState(pcVar9);
  targetType = cmGeneratorTarget::GetType(target);
  pcVar10 = cmState::GetTargetTypeName(targetType);
  std::__cxx11::string::string((string *)&typeName,pcVar10,(allocator *)&linkLineComputer);
  Json::Value::Value(&ttl,arrayValue);
  Json::Value::Value((Value *)&linkLineComputer,"EXECUTABLE");
  Json::Value::append(&ttl,(Value *)&linkLineComputer);
  Json::Value::~Value((Value *)&linkLineComputer);
  Json::Value::Value((Value *)&linkLineComputer,"STATIC_LIBRARY");
  Json::Value::append(&ttl,(Value *)&linkLineComputer);
  Json::Value::~Value((Value *)&linkLineComputer);
  Json::Value::Value((Value *)&linkLineComputer,"SHARED_LIBRARY");
  Json::Value::append(&ttl,(Value *)&linkLineComputer);
  Json::Value::~Value((Value *)&linkLineComputer);
  Json::Value::Value((Value *)&linkLineComputer,"MODULE_LIBRARY");
  Json::Value::append(&ttl,(Value *)&linkLineComputer);
  Json::Value::~Value((Value *)&linkLineComputer);
  Json::Value::Value((Value *)&linkLineComputer,"OBJECT_LIBRARY");
  Json::Value::append(&ttl,(Value *)&linkLineComputer);
  Json::Value::~Value((Value *)&linkLineComputer);
  Json::Value::Value((Value *)&linkLineComputer,"UTILITY");
  Json::Value::append(&ttl,(Value *)&linkLineComputer);
  Json::Value::~Value((Value *)&linkLineComputer);
  Json::Value::Value((Value *)&linkLineComputer,"INTERFACE_LIBRARY");
  Json::Value::append(&ttl,(Value *)&linkLineComputer);
  Json::Value::~Value((Value *)&linkLineComputer);
  bVar7 = Json::Value::isNull(&ttl);
  if (!bVar7) {
    cVar19 = Json::Value::begin(&ttl);
    cVar20 = Json::Value::end(&ttl);
    std::__cxx11::string::string((string *)&frameworkPath,(string *)&typeName);
    std::__cxx11::string::string((string *)&linkLanguageFlags,(string *)&frameworkPath);
    sourcesValue.value_.int_ = (LargestInt)cVar20.super_ValueIteratorBase.current_._M_node;
    sourcesValue._8_1_ = cVar20.super_ValueIteratorBase.isNull_;
    std::__cxx11::string::string((string *)&languageDataMap,(string *)&linkLanguageFlags);
    std::__cxx11::string::string((string *)&languages,(string *)&languageDataMap);
    std::__cxx11::string::string((string *)&linkLineComputer,(string *)&languages);
    std::__cxx11::string::string((string *)&sysroot,(string *)&linkLineComputer);
    std::__cxx11::string::~string((string *)&linkLineComputer);
    std::__cxx11::string::string((string *)&artifacts,(string *)&sysroot);
    local_4b0 = cVar19.super_ValueIteratorBase.isNull_;
    local_4b8.int_ = (LargestInt)cVar19.super_ValueIteratorBase.current_._M_node;
    local_348.int_ = (LargestInt)cVar20.super_ValueIteratorBase.current_._M_node;
    local_340 = cVar20.super_ValueIteratorBase.isNull_;
    while( true ) {
      bVar7 = Json::ValueIteratorBase::operator!=
                        ((ValueIteratorBase *)&local_4b8,(SelfType *)&local_348);
      if (!bVar7) break;
      linkPath._M_dataplus._M_p = (pointer)local_4b8;
      linkPath._M_string_length = CONCAT71(linkPath._M_string_length._1_7_,local_4b0);
      pVVar11 = Json::ValueIteratorBase::deref((ValueIteratorBase *)&linkPath);
      Json::Value::asString_abi_cxx11_((string *)&linkLineComputer,pVVar11);
      _Var8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &linkLineComputer,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &artifacts);
      std::__cxx11::string::~string((string *)&linkLineComputer);
      if (_Var8) break;
      Json::ValueIteratorBase::increment((ValueIteratorBase *)&local_4b8);
    }
    uVar5 = local_4b0;
    VVar4 = local_4b8;
    std::__cxx11::string::~string((string *)&artifacts);
    std::__cxx11::string::~string((string *)&sysroot);
    std::__cxx11::string::~string((string *)&languages);
    local_78.int_ = VVar4.int_;
    local_70 = uVar5;
    bVar7 = Json::ValueIteratorBase::isEqual
                      ((ValueIteratorBase *)&sourcesValue,(SelfType *)&local_78);
    std::__cxx11::string::~string((string *)&languageDataMap);
    std::__cxx11::string::~string((string *)&linkLanguageFlags);
    std::__cxx11::string::~string((string *)&frameworkPath);
    if (!bVar7) {
      bVar7 = cmGeneratorTarget::IsImported(target);
      if (!bVar7) {
        Json::Value::Value(__return_storage_ptr__,objectValue);
        psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(target);
        Json::Value::Value(&local_a0,psVar12);
        pVVar11 = Json::Value::operator[](__return_storage_ptr__,&kNAME_KEY_abi_cxx11_);
        Json::Value::operator=(pVVar11,&local_a0);
        Json::Value::~Value(&local_a0);
        Json::Value::Value(&local_c8,&typeName);
        pVVar11 = Json::Value::operator[](__return_storage_ptr__,&kTYPE_KEY_abi_cxx11_);
        Json::Value::operator=(pVVar11,&local_c8);
        Json::Value::~Value(&local_c8);
        pcVar10 = cmLocalGenerator::GetCurrentSourceDirectory(pcVar9);
        Json::Value::Value(&local_f0,pcVar10);
        pVVar11 = Json::Value::operator[](__return_storage_ptr__,&kSOURCE_DIRECTORY_KEY_abi_cxx11_);
        Json::Value::operator=(pVVar11,&local_f0);
        Json::Value::~Value(&local_f0);
        pcVar10 = cmLocalGenerator::GetCurrentBinaryDirectory(pcVar9);
        Json::Value::Value(&local_118,pcVar10);
        pVVar11 = Json::Value::operator[](__return_storage_ptr__,&kBUILD_DIRECTORY_KEY_abi_cxx11_);
        Json::Value::operator=(pVVar11,&local_118);
        Json::Value::~Value(&local_118);
        if (targetType != INTERFACE_LIBRARY) {
          cmGeneratorTarget::GetFullName
                    ((string *)&linkLineComputer,target,config,RuntimeBinaryArtifact);
          Json::Value::Value(&local_140,(string *)&linkLineComputer);
          pVVar11 = Json::Value::operator[](__return_storage_ptr__,&kFULL_NAME_KEY_abi_cxx11_);
          Json::Value::operator=(pVVar11,&local_140);
          Json::Value::~Value(&local_140);
          std::__cxx11::string::~string((string *)&linkLineComputer);
          Json::Value::Value(&crossRefs,objectValue);
          backtrace = cmTarget::GetBacktrace(target->Target);
          DumpBacktrace(&local_168,backtrace);
          pVVar11 = Json::Value::operator[](&crossRefs,&kBACKTRACE_KEY_abi_cxx11_);
          Json::Value::operator=(pVVar11,&local_168);
          Json::Value::~Value(&local_168);
          Json::Value::Value(&statements,arrayValue);
          std::__cxx11::string::string
                    ((string *)&linkLineComputer,"target_compile_definitions",(allocator *)&sysroot)
          ;
          artifacts._0_16_ = cmTarget::GetCompileDefinitionsBacktraces(target->Target);
          DumpBacktraceRange(&statements,(string *)&linkLineComputer,(cmBacktraceRange *)&artifacts)
          ;
          std::__cxx11::string::~string((string *)&linkLineComputer);
          std::__cxx11::string::string
                    ((string *)&linkLineComputer,"target_include_directories",(allocator *)&sysroot)
          ;
          artifacts._0_16_ = cmTarget::GetIncludeDirectoriesBacktraces(target->Target);
          DumpBacktraceRange(&statements,(string *)&linkLineComputer,(cmBacktraceRange *)&artifacts)
          ;
          std::__cxx11::string::~string((string *)&linkLineComputer);
          std::__cxx11::string::string
                    ((string *)&linkLineComputer,"target_compile_options",(allocator *)&sysroot);
          artifacts._0_16_ = cmTarget::GetCompileOptionsBacktraces(target->Target);
          DumpBacktraceRange(&statements,(string *)&linkLineComputer,(cmBacktraceRange *)&artifacts)
          ;
          std::__cxx11::string::~string((string *)&linkLineComputer);
          std::__cxx11::string::string
                    ((string *)&linkLineComputer,"target_link_libraries",(allocator *)&sysroot);
          artifacts._0_16_ = cmTarget::GetLinkImplementationBacktraces(target->Target);
          DumpBacktraceRange(&statements,(string *)&linkLineComputer,(cmBacktraceRange *)&artifacts)
          ;
          std::__cxx11::string::~string((string *)&linkLineComputer);
          Json::Value::Value(&local_190,&statements);
          pVVar11 = Json::Value::operator[](&crossRefs,&kRELATED_STATEMENTS_KEY_abi_cxx11_);
          Json::Value::operator=(pVVar11,&local_190);
          Json::Value::~Value(&local_190);
          Json::Value::Value(&local_1b8,&crossRefs);
          pVVar11 = Json::Value::operator[]
                              (__return_storage_ptr__,&kTARGET_CROSS_REFERENCES_KEY_abi_cxx11_);
          Json::Value::operator=(pVVar11,&local_1b8);
          Json::Value::~Value(&local_1b8);
          bVar7 = cmGeneratorTarget::HaveWellDefinedOutputFiles(target);
          if (bVar7) {
            Json::Value::Value(&artifacts,arrayValue);
            cmGeneratorTarget::GetFullPath(&sysroot,target,config,RuntimeBinaryArtifact,false);
            Json::Value::Value((Value *)&linkLineComputer,&sysroot);
            Json::Value::append(&artifacts,(Value *)&linkLineComputer);
            Json::Value::~Value((Value *)&linkLineComputer);
            std::__cxx11::string::~string((string *)&sysroot);
            bVar7 = cmGeneratorTarget::IsDLLPlatform(target);
            if (bVar7) {
              cmGeneratorTarget::GetFullPath(&sysroot,target,config,ImportLibraryArtifact,false);
              Json::Value::Value((Value *)&linkLineComputer,&sysroot);
              Json::Value::append(&artifacts,(Value *)&linkLineComputer);
              Json::Value::~Value((Value *)&linkLineComputer);
              std::__cxx11::string::~string((string *)&sysroot);
              pOVar13 = cmGeneratorTarget::GetOutputInfo(target,config);
              if ((pOVar13 != (OutputInfo *)0x0) && ((pOVar13->PdbDir)._M_string_length != 0)) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &languages,&pOVar13->PdbDir,'/');
                cmGeneratorTarget::GetPDBName((string *)&languageDataMap,target,config);
                std::operator+(&sysroot,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&languages,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &languageDataMap);
                Json::Value::Value((Value *)&linkLineComputer,&sysroot);
                Json::Value::append(&artifacts,(Value *)&linkLineComputer);
                Json::Value::~Value((Value *)&linkLineComputer);
                std::__cxx11::string::~string((string *)&sysroot);
                std::__cxx11::string::~string((string *)&languageDataMap);
                std::__cxx11::string::~string((string *)&languages);
              }
            }
            Json::Value::Value(&local_1e0,&artifacts);
            pVVar11 = Json::Value::operator[](__return_storage_ptr__,&kARTIFACTS_KEY_abi_cxx11_);
            Json::Value::operator=(pVVar11,&local_1e0);
            Json::Value::~Value(&local_1e0);
            cmGeneratorTarget::GetLinkerLanguage((string *)&linkLineComputer,target,config);
            Json::Value::Value(&local_208,(string *)&linkLineComputer);
            pVVar11 = Json::Value::operator[]
                                (__return_storage_ptr__,&kLINKER_LANGUAGE_KEY_abi_cxx11_);
            Json::Value::operator=(pVVar11,&local_208);
            Json::Value::~Value(&local_208);
            std::__cxx11::string::~string((string *)&linkLineComputer);
            languages._M_t._M_impl._0_8_ =
                 &languages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            languages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            languages._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
            languageDataMap._M_t._M_impl._0_8_ =
                 &languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
            languages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)
                 ((ulong)languages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent &
                 0xffffffffffffff00);
            languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)
                 ((ulong)languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent &
                 0xffffffffffffff00);
            linkLanguageFlags._M_dataplus._M_p = (pointer)&linkLanguageFlags.field_2;
            linkLanguageFlags._M_string_length = 0;
            frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
            frameworkPath._M_string_length = 0;
            linkLanguageFlags.field_2._M_allocated_capacity =
                 linkLanguageFlags.field_2._M_allocated_capacity & 0xffffffffffffff00;
            frameworkPath.field_2._M_local_buf[0] = '\0';
            linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
            linkPath._M_string_length = 0;
            linkPath.field_2._M_local_buf[0] = '\0';
            cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&local_4b8,pcVar9);
            cmStateSnapshot::GetDirectory
                      ((cmStateDirectory *)&sysroot,(cmStateSnapshot *)&local_4b8);
            cmLinkLineComputer::cmLinkLineComputer
                      (&linkLineComputer,&pcVar9->super_cmOutputConverter,
                       (cmStateDirectory *)&sysroot);
            cmLocalGenerator::GetTargetFlags
                      (pcVar9,&linkLineComputer,config,(string *)&languages,&linkLanguageFlags,
                       (string *)&languageDataMap,&frameworkPath,&linkPath,target);
            cmSystemTools::TrimWhitespace(&sysroot,(string *)&languages);
            std::__cxx11::string::operator=((string *)&languages,(string *)&sysroot);
            std::__cxx11::string::~string((string *)&sysroot);
            cmSystemTools::TrimWhitespace(&sysroot,(string *)&languageDataMap);
            std::__cxx11::string::operator=((string *)&languageDataMap,(string *)&sysroot);
            std::__cxx11::string::~string((string *)&sysroot);
            cmSystemTools::TrimWhitespace(&sysroot,&linkLanguageFlags);
            std::__cxx11::string::operator=((string *)&linkLanguageFlags,(string *)&sysroot);
            std::__cxx11::string::~string((string *)&sysroot);
            cmSystemTools::TrimWhitespace(&sysroot,&frameworkPath);
            std::__cxx11::string::operator=((string *)&frameworkPath,(string *)&sysroot);
            std::__cxx11::string::~string((string *)&sysroot);
            cmSystemTools::TrimWhitespace(&sysroot,&linkPath);
            std::__cxx11::string::operator=((string *)&linkPath,(string *)&sysroot);
            std::__cxx11::string::~string((string *)&sysroot);
            cmSystemTools::TrimWhitespace(&sysroot,(string *)&languages);
            lVar2 = CONCAT44(sysroot._M_string_length._4_4_,(undefined4)sysroot._M_string_length);
            std::__cxx11::string::~string((string *)&sysroot);
            if (lVar2 != 0) {
              Json::Value::Value(&local_230,(string *)&languages);
              pVVar11 = Json::Value::operator[]
                                  (__return_storage_ptr__,&kLINK_LIBRARIES_KEY_abi_cxx11_);
              Json::Value::operator=(pVVar11,&local_230);
              Json::Value::~Value(&local_230);
            }
            cmSystemTools::TrimWhitespace(&sysroot,(string *)&languageDataMap);
            lVar2 = CONCAT44(sysroot._M_string_length._4_4_,(undefined4)sysroot._M_string_length);
            std::__cxx11::string::~string((string *)&sysroot);
            if (lVar2 != 0) {
              Json::Value::Value(&local_258,(string *)&languageDataMap);
              pVVar11 = Json::Value::operator[](__return_storage_ptr__,&kLINK_FLAGS_KEY_abi_cxx11_);
              Json::Value::operator=(pVVar11,&local_258);
              Json::Value::~Value(&local_258);
            }
            cmSystemTools::TrimWhitespace(&sysroot,&linkLanguageFlags);
            lVar2 = CONCAT44(sysroot._M_string_length._4_4_,(undefined4)sysroot._M_string_length);
            std::__cxx11::string::~string((string *)&sysroot);
            if (lVar2 != 0) {
              Json::Value::Value(&local_280,&linkLanguageFlags);
              pVVar11 = Json::Value::operator[]
                                  (__return_storage_ptr__,&kLINK_LANGUAGE_FLAGS_KEY_abi_cxx11_);
              Json::Value::operator=(pVVar11,&local_280);
              Json::Value::~Value(&local_280);
            }
            if (frameworkPath._M_string_length != 0) {
              Json::Value::Value(&local_2a8,&frameworkPath);
              pVVar11 = Json::Value::operator[]
                                  (__return_storage_ptr__,&kFRAMEWORK_PATH_KEY_abi_cxx11_);
              Json::Value::operator=(pVVar11,&local_2a8);
              Json::Value::~Value(&local_2a8);
            }
            if (linkPath._M_string_length != 0) {
              Json::Value::Value(&local_2d0,&linkPath);
              pVVar11 = Json::Value::operator[](__return_storage_ptr__,&kLINK_PATH_KEY_abi_cxx11_);
              Json::Value::operator=(pVVar11,&local_2d0);
              Json::Value::~Value(&local_2d0);
            }
            this = pcVar9->Makefile;
            std::__cxx11::string::string
                      ((string *)&local_4b8.bool_,"CMAKE_SYSROOT",(allocator *)&local_348.bool_);
            pcVar10 = cmMakefile::GetSafeDefinition(this,(string *)&local_4b8);
            std::__cxx11::string::string((string *)&sysroot,pcVar10,(allocator *)&sourcesValue);
            std::__cxx11::string::~string((string *)&local_4b8.bool_);
            if (CONCAT44(sysroot._M_string_length._4_4_,(undefined4)sysroot._M_string_length) != 0)
            {
              Json::Value::Value(&local_2f8,&sysroot);
              pVVar11 = Json::Value::operator[](__return_storage_ptr__,&kSYSROOT_KEY_abi_cxx11_);
              Json::Value::operator=(pVVar11,&local_2f8);
              Json::Value::~Value(&local_2f8);
            }
            std::__cxx11::string::~string((string *)&sysroot);
            cmLinkLineComputer::~cmLinkLineComputer(&linkLineComputer);
            std::__cxx11::string::~string((string *)&linkPath);
            std::__cxx11::string::~string((string *)&frameworkPath);
            std::__cxx11::string::~string((string *)&linkLanguageFlags);
            std::__cxx11::string::~string((string *)&languageDataMap);
            std::__cxx11::string::~string((string *)&languages);
            Json::Value::~Value(&artifacts);
          }
          languages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &languages._M_t._M_impl.super__Rb_tree_header._M_header;
          languages._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               languages._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
          languages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          languages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          languages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               languages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          cmGeneratorTarget::GetLanguages(target,&languages,config);
          languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header;
          languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
               0xffffffff00000000;
          languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          languageDataMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          for (p_Var15 = languages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var15 != &languages._M_t._M_impl.super__Rb_tree_header;
              p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15)) {
            __k = p_Var15 + 1;
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>_>_>
                      ::operator[](&languageDataMap,(key_type *)__k);
            std::__cxx11::string::_M_assign((string *)&pmVar14->Language);
            cmLocalGenerator::GetTargetCompileFlags
                      (pcVar9,target,config,(string *)__k,&pmVar14->Flags);
            linkLineComputer.StateDir.DirectoryState.Tree =
                 (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)
                 ((ulong)linkLineComputer.StateDir.DirectoryState.Tree & 0xffffffff00000000);
            linkLineComputer.StateDir.DirectoryState.Position = 0;
            linkLineComputer.StateDir.Snapshot_.State = (cmState *)&linkLineComputer.StateDir;
            linkLineComputer.StateDir.Snapshot_.Position.Position = 0;
            linkLineComputer.StateDir.Snapshot_.Position.Tree =
                 (cmLinkedTree<cmStateDetail::SnapshotDataType> *)
                 linkLineComputer.StateDir.Snapshot_.State;
            cmLocalGenerator::GetTargetDefines
                      (pcVar9,target,config,(string *)__k,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&linkLineComputer);
            LanguageData::SetDefines
                      (pmVar14,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&linkLineComputer);
            linkLanguageFlags._M_dataplus._M_p = (pointer)0x0;
            linkLanguageFlags._M_string_length = 0;
            linkLanguageFlags.field_2._M_allocated_capacity = 0;
            cmLocalGenerator::GetIncludeDirectories
                      (pcVar9,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&linkLanguageFlags,target,(string *)__k,config,true);
            sVar3 = linkLanguageFlags._M_string_length;
            for (_Var18 = linkLanguageFlags._M_dataplus; _Var18._M_p != (pointer)sVar3;
                _Var18._M_p = _Var18._M_p + 0x20) {
              std::__cxx11::string::string((string *)&sysroot,(string *)_Var18._M_p);
              bVar7 = cmGeneratorTarget::IsSystemIncludeDirectory(target,&sysroot,config);
              std::__cxx11::string::string((string *)&artifacts,(string *)&sysroot);
              artifacts.limit_._0_1_ = bVar7;
              std::
              vector<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>
              ::emplace_back<std::pair<std::__cxx11::string,bool>>
                        ((vector<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>
                          *)&pmVar14->IncludePathList,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
                          *)&artifacts);
              std::__cxx11::string::~string((string *)&artifacts);
              std::__cxx11::string::~string((string *)&sysroot);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&linkLanguageFlags);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&linkLineComputer);
          }
          files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          cmGeneratorTarget::GetSourceFiles(target,&files,config);
          ppcVar6 = files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          artifacts._8_8_ = 1;
          artifacts.value_.string_ = (char *)&p_Stack_4c0;
          artifacts.comments_ = (CommentInfo *)0x0;
          artifacts.start_ = 0;
          artifacts.limit_._0_4_ = 0x3f800000;
          p_Stack_4c0 = (__node_base_ptr)0x0;
          for (ppcVar16 = files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start; ppcVar16 != ppcVar6;
              ppcVar16 = ppcVar16 + 1) {
            this_00 = *ppcVar16;
            linkLineComputer._vptr_cmLinkLineComputer._0_1_ = 0;
            linkLineComputer.StateDir.DirectoryState.Tree =
                 (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)
                 &linkLineComputer.StateDir.Snapshot_;
            linkLineComputer.StateDir.DirectoryState.Position = 0;
            linkLineComputer.StateDir.Snapshot_.State =
                 (cmState *)((ulong)linkLineComputer.StateDir.Snapshot_.State & 0xffffffffffffff00);
            linkLineComputer.StateDir.Snapshot_.Position.Position =
                 (PositionType)&linkLineComputer.ForResponse;
            linkLineComputer.OutputConverter = (cmOutputConverter *)0x0;
            linkLineComputer.ForResponse = false;
            vStack_5f0.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            vStack_5f0.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            vStack_5f0.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            cmSourceFile::GetLanguage_abi_cxx11_(&sysroot,this_00);
            std::__cxx11::string::operator=((string *)&linkLineComputer.StateDir,(string *)&sysroot)
            ;
            std::__cxx11::string::~string((string *)&sysroot);
            if (linkLineComputer.StateDir.DirectoryState.Position != 0) {
              pmVar14 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>_>_>
                        ::at(&languageDataMap,(key_type *)&linkLineComputer.StateDir);
              pcVar9 = cmGeneratorTarget::GetLocalGenerator(target);
              std::__cxx11::string::string((string *)&linkLanguageFlags,(string *)&pmVar14->Flags);
              std::__cxx11::string::string
                        ((string *)&sysroot,"COMPILE_FLAGS",(allocator *)&frameworkPath);
              pcVar10 = cmSourceFile::GetProperty(this_00,&sysroot);
              std::__cxx11::string::~string((string *)&sysroot);
              if (pcVar10 != (char *)0x0) {
                cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&frameworkPath);
                cmGeneratorExpression::cmGeneratorExpression
                          ((cmGeneratorExpression *)&sysroot,(cmListFileBacktrace *)&frameworkPath);
                cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&frameworkPath);
                cmGeneratorExpression::Parse
                          ((cmGeneratorExpression *)&frameworkPath,(char *)&sysroot);
                linkPath._M_dataplus = frameworkPath._M_dataplus;
                frameworkPath._M_dataplus._M_p = (pointer)0x0;
                cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                          ((auto_ptr<cmCompiledGeneratorExpression> *)&frameworkPath);
                _Var18 = linkPath._M_dataplus;
                lg = cmGeneratorTarget::GetLocalGenerator(target);
                frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
                frameworkPath._M_string_length = 0;
                frameworkPath.field_2._M_local_buf[0] = '\0';
                pcVar10 = cmCompiledGeneratorExpression::Evaluate
                                    ((cmCompiledGeneratorExpression *)_Var18._M_p,lg,config,false,
                                     (cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                                     (cmGeneratorExpressionDAGChecker *)0x0,&frameworkPath);
                std::__cxx11::string::~string((string *)&frameworkPath);
                (*pcVar9->_vptr_cmLocalGenerator[7])(pcVar9,&linkLanguageFlags,pcVar10);
                cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                          ((auto_ptr<cmCompiledGeneratorExpression> *)&linkPath);
                cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&sysroot);
              }
              std::__cxx11::string::_M_assign
                        ((string *)&linkLineComputer.StateDir.Snapshot_.Position.Position);
              std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              ::operator=(&vStack_5f0,&pmVar14->IncludePathList);
              sysroot._M_string_length._0_4_ = 0;
              sysroot.field_2._M_allocated_capacity = 0;
              sysroot.field_2._8_8_ = &sysroot._M_string_length;
              std::__cxx11::string::string
                        ((string *)&frameworkPath,"COMPILE_DEFINITIONS",(allocator *)&linkPath);
              pcVar10 = cmSourceFile::GetProperty(this_00,&frameworkPath);
              cmLocalGenerator::AppendDefines
                        (pcVar9,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&sysroot,pcVar10);
              std::__cxx11::string::~string((string *)&frameworkPath);
              cmsys::SystemTools::UpperCase(&linkPath,config);
              std::operator+(&frameworkPath,"COMPILE_DEFINITIONS_",&linkPath);
              std::__cxx11::string::~string((string *)&linkPath);
              pcVar10 = cmSourceFile::GetProperty(this_00,&frameworkPath);
              cmLocalGenerator::AppendDefines
                        (pcVar9,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&sysroot,pcVar10);
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::
              _M_insert_range_unique<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&sysroot,
                         (pmVar14->Defines).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (pmVar14->Defines).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              LanguageData::SetDefines
                        ((LanguageData *)&linkLineComputer,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&sysroot);
              std::__cxx11::string::~string((string *)&frameworkPath);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&sysroot);
              std::__cxx11::string::~string((string *)&linkLanguageFlags);
            }
            std::__cxx11::string::string
                      ((string *)&sysroot,"GENERATED",(allocator *)&linkLanguageFlags);
            linkLineComputer._vptr_cmLinkLineComputer._0_1_ =
                 cmSourceFile::GetPropertyAsBool(this_00,&sysroot);
            std::__cxx11::string::~string((string *)&sysroot);
            this_01 = std::__detail::
                      _Map_base<LanguageData,_std::pair<const_LanguageData,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_LanguageData,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<LanguageData>,_std::hash<LanguageData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<LanguageData,_std::pair<const_LanguageData,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_LanguageData,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<LanguageData>,_std::hash<LanguageData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&artifacts,(key_type *)&linkLineComputer);
            psVar12 = cmSourceFile::GetFullPath(this_00,(string *)0x0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(this_01,psVar12);
            LanguageData::~LanguageData((LanguageData *)&linkLineComputer);
          }
          pcVar10 = cmMakefile::GetCurrentSourceDirectory(target->Makefile);
          std::__cxx11::string::string((string *)&baseDir,pcVar10,(allocator *)&linkLineComputer);
          Json::Value::Value(&sourceGroupsValue,arrayValue);
          for (pCVar17 = artifacts.comments_; pCVar17 != (CommentInfo *)0x0;
              pCVar17 = (CommentInfo *)pCVar17->comment_) {
            Json::Value::Value(&local_468,objectValue);
            if (pCVar17[3].comment_ != (char *)0x0) {
              Json::Value::Value((Value *)&linkLineComputer,(string *)(pCVar17 + 2));
              pVVar11 = Json::Value::operator[](&local_468,&kLANGUAGE_KEY_abi_cxx11_);
              Json::Value::operator=(pVVar11,(Value *)&linkLineComputer);
              Json::Value::~Value((Value *)&linkLineComputer);
              in = extraout_RDX;
              if (pCVar17[7].comment_ != (char *)0x0) {
                Json::Value::Value((Value *)&sysroot,(string *)(pCVar17 + 6));
                pVVar11 = Json::Value::operator[](&local_468,&kCOMPILE_FLAGS_KEY_abi_cxx11_);
                Json::Value::operator=(pVVar11,(Value *)&sysroot);
                Json::Value::~Value((Value *)&sysroot);
                in = extraout_RDX_00;
              }
              if (pCVar17[0xd].comment_ != pCVar17[0xe].comment_) {
                Json::Value::Value((Value *)&linkLanguageFlags,arrayValue);
                psVar1 = (string *)pCVar17[0xe].comment_;
                for (psVar12 = (string *)pCVar17[0xd].comment_; psVar12 != psVar1;
                    psVar12 = (string *)&psVar12[1]._M_string_length) {
                  Json::Value::Value((Value *)&frameworkPath,objectValue);
                  Json::Value::Value((Value *)&linkPath,psVar12);
                  pVVar11 = Json::Value::operator[]((Value *)&frameworkPath,&kPATH_KEY_abi_cxx11_);
                  Json::Value::operator=(pVVar11,(Value *)&linkPath);
                  Json::Value::~Value((Value *)&linkPath);
                  if (*(char *)&psVar12[1]._M_dataplus._M_p == '\x01') {
                    Json::Value::Value((Value *)&local_4b8,true);
                    pVVar11 = Json::Value::operator[]
                                        ((Value *)&frameworkPath,&kIS_SYSTEM_KEY_abi_cxx11_);
                    Json::Value::operator=(pVVar11,(Value *)&local_4b8);
                    Json::Value::~Value((Value *)&local_4b8);
                  }
                  Json::Value::append((Value *)&linkLanguageFlags,(Value *)&frameworkPath);
                  Json::Value::~Value((Value *)&frameworkPath);
                }
                Json::Value::Value((Value *)&frameworkPath,(Value *)&linkLanguageFlags);
                pVVar11 = Json::Value::operator[](&local_468,&kINCLUDE_PATH_KEY_abi_cxx11_);
                Json::Value::operator=(pVVar11,(Value *)&frameworkPath);
                Json::Value::~Value((Value *)&frameworkPath);
                Json::Value::~Value((Value *)&linkLanguageFlags);
                in = extraout_RDX_01;
              }
              if (pCVar17[10].comment_ != pCVar17[0xb].comment_) {
                (anonymous_namespace)::
                fromStringList<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          ((Value *)&linkLanguageFlags,(_anonymous_namespace_ *)(pCVar17 + 10),in);
                pVVar11 = Json::Value::operator[](&local_468,&kDEFINES_KEY_abi_cxx11_);
                Json::Value::operator=(pVVar11,(Value *)&linkLanguageFlags);
                Json::Value::~Value((Value *)&linkLanguageFlags);
              }
            }
            remote = pCVar17;
            Json::Value::Value((Value *)&local_348,*(bool *)&pCVar17[1].comment_);
            pVVar11 = Json::Value::operator[](&local_468,&kIS_GENERATED_KEY_abi_cxx11_);
            Json::Value::operator=(pVVar11,(Value *)&local_348);
            Json::Value::~Value((Value *)&local_348);
            Json::Value::Value(&sourcesValue,arrayValue);
            psVar1 = (string *)pCVar17[0x11].comment_;
            for (psVar12 = (string *)pCVar17[0x10].comment_; psVar12 != psVar1;
                psVar12 = psVar12 + 1) {
              cmSystemTools::RelativePath_abi_cxx11_
                        (&relPath,(cmSystemTools *)baseDir._M_dataplus._M_p,
                         (psVar12->_M_dataplus)._M_p,(char *)remote);
              value = &relPath;
              if (psVar12->_M_string_length <= relPath._M_string_length) {
                value = psVar12;
              }
              Json::Value::Value((Value *)&local_78,value);
              Json::Value::append(&sourcesValue,(Value *)&local_78);
              Json::Value::~Value((Value *)&local_78);
              std::__cxx11::string::~string((string *)&relPath);
            }
            Json::Value::Value((Value *)&local_78,&sourcesValue);
            pVVar11 = Json::Value::operator[](&local_468,&kSOURCES_KEY_abi_cxx11_);
            Json::Value::operator=(pVVar11,(Value *)&local_78);
            Json::Value::~Value((Value *)&local_78);
            Json::Value::~Value(&sourcesValue);
            bVar7 = Json::Value::isNull(&local_468);
            if (!bVar7) {
              Json::Value::append(&sourceGroupsValue,&local_468);
            }
            Json::Value::~Value(&local_468);
          }
          std::__cxx11::string::~string((string *)&baseDir);
          std::
          _Hashtable<LanguageData,_std::pair<const_LanguageData,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_LanguageData,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<LanguageData>,_std::hash<LanguageData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<LanguageData,_std::pair<const_LanguageData,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_LanguageData,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<LanguageData>,_std::hash<LanguageData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)&artifacts);
          std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
                    (&files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
          bVar7 = Json::Value::empty(&sourceGroupsValue);
          if (!bVar7) {
            Json::Value::Value(&local_320,&sourceGroupsValue);
            pVVar11 = Json::Value::operator[](__return_storage_ptr__,&kFILE_GROUPS_KEY_abi_cxx11_);
            Json::Value::operator=(pVVar11,&local_320);
            Json::Value::~Value(&local_320);
          }
          Json::Value::~Value(&sourceGroupsValue);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>_>_>
          ::~_Rb_tree(&languageDataMap._M_t);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&languages._M_t);
          Json::Value::~Value(&statements);
          Json::Value::~Value(&crossRefs);
        }
        goto LAB_004d0d78;
      }
    }
  }
  Json::Value::Value(__return_storage_ptr__,nullValue);
LAB_004d0d78:
  Json::Value::~Value(&ttl);
  std::__cxx11::string::~string((string *)&typeName);
  return __return_storage_ptr__;
}

Assistant:

static Json::Value DumpTarget(cmGeneratorTarget* target,
                              const std::string& config)
{
  cmLocalGenerator* lg = target->GetLocalGenerator();
  const cmState* state = lg->GetState();

  const cmStateEnums::TargetType type = target->GetType();
  const std::string typeName = state->GetTargetTypeName(type);

  Json::Value ttl = Json::arrayValue;
  ttl.append("EXECUTABLE");
  ttl.append("STATIC_LIBRARY");
  ttl.append("SHARED_LIBRARY");
  ttl.append("MODULE_LIBRARY");
  ttl.append("OBJECT_LIBRARY");
  ttl.append("UTILITY");
  ttl.append("INTERFACE_LIBRARY");

  if (!hasString(ttl, typeName) || target->IsImported()) {
    return Json::Value();
  }

  Json::Value result = Json::objectValue;
  result[kNAME_KEY] = target->GetName();
  result[kTYPE_KEY] = typeName;
  result[kSOURCE_DIRECTORY_KEY] = lg->GetCurrentSourceDirectory();
  result[kBUILD_DIRECTORY_KEY] = lg->GetCurrentBinaryDirectory();

  if (type == cmStateEnums::INTERFACE_LIBRARY) {
    return result;
  }

  result[kFULL_NAME_KEY] = target->GetFullName(config);

  Json::Value crossRefs = Json::objectValue;
  crossRefs[kBACKTRACE_KEY] = DumpBacktrace(target->Target->GetBacktrace());

  Json::Value statements = Json::arrayValue;
  DumpBacktraceRange(statements, "target_compile_definitions",
                     target->Target->GetCompileDefinitionsBacktraces());
  DumpBacktraceRange(statements, "target_include_directories",
                     target->Target->GetIncludeDirectoriesBacktraces());
  DumpBacktraceRange(statements, "target_compile_options",
                     target->Target->GetCompileOptionsBacktraces());
  DumpBacktraceRange(statements, "target_link_libraries",
                     target->Target->GetLinkImplementationBacktraces());

  crossRefs[kRELATED_STATEMENTS_KEY] = std::move(statements);
  result[kTARGET_CROSS_REFERENCES_KEY] = std::move(crossRefs);

  if (target->HaveWellDefinedOutputFiles()) {
    Json::Value artifacts = Json::arrayValue;
    artifacts.append(
      target->GetFullPath(config, cmStateEnums::RuntimeBinaryArtifact));
    if (target->IsDLLPlatform()) {
      artifacts.append(
        target->GetFullPath(config, cmStateEnums::ImportLibraryArtifact));
      const cmGeneratorTarget::OutputInfo* output =
        target->GetOutputInfo(config);
      if (output && !output->PdbDir.empty()) {
        artifacts.append(output->PdbDir + '/' + target->GetPDBName(config));
      }
    }
    result[kARTIFACTS_KEY] = artifacts;

    result[kLINKER_LANGUAGE_KEY] = target->GetLinkerLanguage(config);

    std::string linkLibs;
    std::string linkFlags;
    std::string linkLanguageFlags;
    std::string frameworkPath;
    std::string linkPath;
    cmLinkLineComputer linkLineComputer(lg,
                                        lg->GetStateSnapshot().GetDirectory());
    lg->GetTargetFlags(&linkLineComputer, config, linkLibs, linkLanguageFlags,
                       linkFlags, frameworkPath, linkPath, target);

    linkLibs = cmSystemTools::TrimWhitespace(linkLibs);
    linkFlags = cmSystemTools::TrimWhitespace(linkFlags);
    linkLanguageFlags = cmSystemTools::TrimWhitespace(linkLanguageFlags);
    frameworkPath = cmSystemTools::TrimWhitespace(frameworkPath);
    linkPath = cmSystemTools::TrimWhitespace(linkPath);

    if (!cmSystemTools::TrimWhitespace(linkLibs).empty()) {
      result[kLINK_LIBRARIES_KEY] = linkLibs;
    }
    if (!cmSystemTools::TrimWhitespace(linkFlags).empty()) {
      result[kLINK_FLAGS_KEY] = linkFlags;
    }
    if (!cmSystemTools::TrimWhitespace(linkLanguageFlags).empty()) {
      result[kLINK_LANGUAGE_FLAGS_KEY] = linkLanguageFlags;
    }
    if (!frameworkPath.empty()) {
      result[kFRAMEWORK_PATH_KEY] = frameworkPath;
    }
    if (!linkPath.empty()) {
      result[kLINK_PATH_KEY] = linkPath;
    }
    const std::string sysroot =
      lg->GetMakefile()->GetSafeDefinition("CMAKE_SYSROOT");
    if (!sysroot.empty()) {
      result[kSYSROOT_KEY] = sysroot;
    }
  }

  std::set<std::string> languages;
  target->GetLanguages(languages, config);
  std::map<std::string, LanguageData> languageDataMap;
  for (const auto& lang : languages) {
    LanguageData& ld = languageDataMap[lang];
    ld.Language = lang;
    lg->GetTargetCompileFlags(target, config, lang, ld.Flags);
    std::set<std::string> defines;
    lg->GetTargetDefines(target, config, lang, defines);
    ld.SetDefines(defines);
    std::vector<std::string> includePathList;
    lg->GetIncludeDirectories(includePathList, target, lang, config, true);
    for (auto i : includePathList) {
      ld.IncludePathList.push_back(
        std::make_pair(i, target->IsSystemIncludeDirectory(i, config)));
    }
  }

  Json::Value sourceGroupsValue =
    DumpSourceFilesList(target, config, languageDataMap);
  if (!sourceGroupsValue.empty()) {
    result[kFILE_GROUPS_KEY] = sourceGroupsValue;
  }

  return result;
}